

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int client_handle_finished(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message)

{
  ptls_key_schedule_t *ppVar1;
  ptls_buffer_t *buf;
  size_t sVar2;
  uint8_t *puVar3;
  int iVar4;
  long lVar5;
  ptls_hash_context_t **pppVar6;
  size_t sVar7;
  size_t sVar8;
  bool bVar9;
  ptls_iovec_t context;
  ptls_message_emitter_t *_emitter;
  uint8_t send_secret [64];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar4 = verify_finished(tls,message);
  if (iVar4 == 0) {
    ppVar1 = tls->key_schedule;
    if (ppVar1->num_hashes != 0) {
      pppVar6 = &ppVar1->hashes[0].ctx;
      sVar8 = 0;
      do {
        (*(*pppVar6)->update)(*pppVar6,message.base,message.len);
        sVar8 = sVar8 + 1;
        pppVar6 = pppVar6 + 2;
      } while (sVar8 != ppVar1->num_hashes);
    }
    iVar4 = key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
    if ((((iVar4 == 0) && (iVar4 = setup_traffic_protection(tls,0,"s ap traffic",3,0), iVar4 == 0))
        && (iVar4 = derive_secret(tls->key_schedule,&local_78,"c ap traffic"), iVar4 == 0)) &&
       (iVar4 = derive_exporter_secret(tls,0), iVar4 == 0)) {
      if (tls->pending_handshake_secret != (uint8_t *)0x0) {
        if (((tls->traffic_protection).enc.aead == (ptls_aead_context_t *)0x0) &&
           (tls->ctx->update_traffic_key == (ptls_update_traffic_key_t *)0x0)) {
          __assert_fail("tls->traffic_protection.enc.aead != NULL || tls->ctx->update_traffic_key != NULL"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                        ,0xb25,
                        "int client_handle_finished(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t)"
                       );
        }
        if ((((tls->field_20).server.pending_traffic_secret[0x28] & 2) != 0) &&
           ((tls->ctx->field_0x68 & 0x10) == 0)) {
          iVar4 = (*emitter->begin_message)(emitter);
          if (iVar4 == 0) {
            buf = emitter->buf;
            ppVar1 = tls->key_schedule;
            sVar8 = buf->off;
            iVar4 = ptls_buffer_reserve(buf,1);
            if (iVar4 == 0) {
              buf->base[buf->off] = '\x05';
              buf->off = buf->off + 1;
              iVar4 = 0;
            }
            bVar9 = true;
            if (iVar4 == 0) {
              iVar4 = ptls_buffer_reserve(buf,3);
              if (iVar4 == 0) {
                puVar3 = buf->base;
                sVar2 = buf->off;
                puVar3[sVar2 + 2] = '\0';
                puVar3 = puVar3 + sVar2;
                puVar3[0] = '\0';
                puVar3[1] = '\0';
                buf->off = buf->off + 3;
                iVar4 = 0;
              }
              bVar9 = true;
              if (iVar4 == 0) {
                sVar2 = buf->off;
                lVar5 = -3;
                do {
                  buf->base[lVar5 + sVar2] = '\0';
                  lVar5 = lVar5 + 1;
                } while (lVar5 != 0);
                bVar9 = false;
              }
              if (iVar4 == 0) {
                if ((ppVar1 != (ptls_key_schedule_t *)0x0) && (ppVar1->num_hashes != 0)) {
                  puVar3 = buf->base;
                  sVar2 = buf->off;
                  pppVar6 = &ppVar1->hashes[0].ctx;
                  sVar7 = 0;
                  do {
                    (*(*pppVar6)->update)(*pppVar6,puVar3 + sVar8,sVar2 - sVar8);
                    sVar7 = sVar7 + 1;
                    pppVar6 = pppVar6 + 2;
                  } while (sVar7 != ppVar1->num_hashes);
                }
                bVar9 = false;
              }
            }
            if (!bVar9) {
              iVar4 = (*emitter->commit_message)(emitter);
              bVar9 = iVar4 != 0;
            }
          }
          else {
            bVar9 = true;
          }
          if (bVar9) goto LAB_001163c4;
          if (bVar9) {
            return iVar4;
          }
        }
        puVar3 = (tls->field_20).server.pending_traffic_secret + 0x28;
        *puVar3 = *puVar3 & 0xfd;
        iVar4 = commission_handshake_secret(tls);
        if (iVar4 != 0) goto LAB_001163c4;
      }
      puVar3 = (tls->field_20).client.certificate_request.context.base;
      if (puVar3 != (uint8_t *)0x0) {
        iVar4 = 0x2f;
        if ((tls->field_0x160 & 2) != 0) goto LAB_001163c4;
        context.len = (tls->field_20).client.certificate_request.context.len;
        context.base = puVar3;
        iVar4 = send_certificate_and_certificate_verify
                          (tls,emitter,
                           &(tls->field_20).client.certificate_request.signature_algorithms,context,
                           "TLS 1.3, client CertificateVerify",0);
        free((tls->field_20).client.certificate_request.context.base);
        (tls->field_20).client.certificate_request.context.base = (uint8_t *)0x0;
        (tls->field_20).client.certificate_request.context.len = 0;
        if (iVar4 != 0) goto LAB_001163c4;
      }
      iVar4 = push_change_cipher_spec(tls,emitter->buf);
      if (iVar4 == 0) {
        send_finished(tls,emitter);
        *(undefined8 *)((tls->traffic_protection).enc.secret + 0x30) = local_48;
        *(undefined8 *)((tls->traffic_protection).enc.secret + 0x38) = uStack_40;
        *(undefined8 *)((tls->traffic_protection).enc.secret + 0x20) = local_58;
        *(undefined8 *)((tls->traffic_protection).enc.secret + 0x28) = uStack_50;
        *(undefined8 *)((tls->traffic_protection).enc.secret + 0x10) = local_68;
        *(undefined8 *)((tls->traffic_protection).enc.secret + 0x18) = uStack_60;
        *(undefined8 *)(tls->traffic_protection).enc.secret = local_78;
        *(undefined8 *)((tls->traffic_protection).enc.secret + 8) = uStack_70;
        iVar4 = setup_traffic_protection(tls,1,(char *)0x0,3,0);
        if (iVar4 == 0) {
          tls->state = PTLS_STATE_CLIENT_POST_HANDSHAKE;
          iVar4 = 0;
        }
      }
    }
  }
LAB_001163c4:
  (*ptls_clear_memory)(&local_78,0x40);
  return iVar4;
}

Assistant:

static int client_handle_finished(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message)
{
    uint8_t send_secret[PTLS_MAX_DIGEST_SIZE];
    int ret;

    if ((ret = verify_finished(tls, message)) != 0)
        goto Exit;
    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);

    /* update traffic keys by using messages upto ServerFinished, but commission them after sending ClientFinished */
    if ((ret = key_schedule_extract(tls->key_schedule, ptls_iovec_init(NULL, 0))) != 0)
        goto Exit;
    if ((ret = setup_traffic_protection(tls, 0, "s ap traffic", 3, 0)) != 0)
        goto Exit;
    if ((ret = derive_secret(tls->key_schedule, send_secret, "c ap traffic")) != 0)
        goto Exit;
    if ((ret = derive_exporter_secret(tls, 0)) != 0)
        goto Exit;

    /* if sending early data, emit EOED and commision the client handshake traffic secret */
    if (tls->pending_handshake_secret != NULL) {
        assert(tls->traffic_protection.enc.aead != NULL || tls->ctx->update_traffic_key != NULL);
        if (tls->client.using_early_data && !tls->ctx->omit_end_of_early_data)
            ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_END_OF_EARLY_DATA, {});
        tls->client.using_early_data = 0;
        if ((ret = commission_handshake_secret(tls)) != 0)
            goto Exit;
    }

    if (tls->client.certificate_request.context.base != NULL) {
        /* If this is a resumed session, the server must not send the certificate request in the handshake */
        if (tls->is_psk_handshake) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
        ret = send_certificate_and_certificate_verify(tls, emitter, &tls->client.certificate_request.signature_algorithms,
                                                      tls->client.certificate_request.context,
                                                      PTLS_CLIENT_CERTIFICATE_VERIFY_CONTEXT_STRING, 0);
        free(tls->client.certificate_request.context.base);
        tls->client.certificate_request.context = ptls_iovec_init(NULL, 0);
        if (ret != 0)
            goto Exit;
    }

    if ((ret = push_change_cipher_spec(tls, emitter->buf)) != 0)
        goto Exit;
    ret = send_finished(tls, emitter);

    memcpy(tls->traffic_protection.enc.secret, send_secret, sizeof(send_secret));
    if ((ret = setup_traffic_protection(tls, 1, NULL, 3, 0)) != 0)
        goto Exit;

    tls->state = PTLS_STATE_CLIENT_POST_HANDSHAKE;

Exit:
    ptls_clear_memory(send_secret, sizeof(send_secret));
    return ret;
}